

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O1

void __thiscall
slang::ast::SequenceRepetition::SequenceRepetition
          (SequenceRepetition *this,SequenceRepetitionSyntax *syntax,ASTContext *context)

{
  TokenKind TVar1;
  SequenceRange SVar2;
  
  this->kind = Consecutive;
  (this->range).min = 1;
  (this->range).max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int>._M_engaged = false;
  TVar1 = (syntax->op).kind;
  if (TVar1 < MinusArrow) {
    if (TVar1 == Star) {
      this->kind = Consecutive;
      (this->range).min = 0;
      goto LAB_00493ae4;
    }
    if (TVar1 == Plus) {
      this->kind = Consecutive;
      (this->range).min = 1;
      return;
    }
  }
  else {
    if (TVar1 == MinusArrow) {
      this->kind = GoTo;
      goto LAB_00493ae4;
    }
    if (TVar1 == Equals) {
      this->kind = Nonconsecutive;
      goto LAB_00493ae4;
    }
  }
  this->kind = Consecutive;
LAB_00493ae4:
  if (syntax->selector != (SelectorSyntax *)0x0) {
    SVar2 = SequenceRange::fromSyntax(syntax->selector,context,true);
    (this->range).min = (int)SVar2._0_8_;
    (this->range).max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_int>._M_payload =
         (_Storage<unsigned_int,_true>)(int)((ulong)SVar2._0_8_ >> 0x20);
    (this->range).max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_int>._M_engaged =
         SVar2.max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_int>._M_engaged;
  }
  return;
}

Assistant:

SequenceRepetition::SequenceRepetition(const SequenceRepetitionSyntax& syntax,
                                       const ASTContext& context) {
    switch (syntax.op.kind) {
        case TokenKind::Equals:
            kind = Nonconsecutive;
            break;
        case TokenKind::MinusArrow:
            kind = GoTo;
            break;
        case TokenKind::Plus:
            // No expressions allowed for plus.
            kind = Consecutive;
            range.min = 1;
            return;
        case TokenKind::Star:
            kind = Consecutive;
            range.min = 0;
            break;
        default:
            kind = Consecutive;
            break;
    }

    if (syntax.selector)
        range = SequenceRange::fromSyntax(*syntax.selector, context, /* allowUnbounded */ true);
}